

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O1

bool __thiscall Movie::Verify(Movie *this,Verifier *verifier)

{
  bool bVar1;
  Movie MVar2;
  ushort uVar3;
  long lVar4;
  unsigned_short vtsize;
  Vector<unsigned_char,_unsigned_int> *types;
  String *str;
  ulong uVar5;
  Movie *pMVar6;
  Vector<flatbuffers::Offset<void>,_unsigned_int> *values;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if (!bVar1) {
    return false;
  }
  if (*(ushort *)(this + -(long)*(int *)this) < 5) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(this + (4 - (long)*(int *)this));
  }
  if (uVar3 != 0) {
    if (verifier->size_ < 2) {
      return false;
    }
    if ((Movie *)(verifier->size_ - 1) < this + ((ulong)uVar3 - (long)verifier->buf_)) {
      return false;
    }
  }
  bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6);
  if (!bVar1) {
    return false;
  }
  lVar4 = -(long)*(int *)this;
  if (*(ushort *)(this + -(long)*(int *)this) < 7) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(this + lVar4 + 6);
  }
  if (uVar3 == 0) {
    str = (String *)0x0;
  }
  else {
    str = (String *)(this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
  }
  if (*(ushort *)(this + -(long)*(int *)this) < 5) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(this + lVar4 + 4);
  }
  if (uVar3 == 0) {
    MVar2.super_Table = (Table)0x0;
  }
  else {
    MVar2.super_Table = this[uVar3].super_Table;
  }
  switch(MVar2.super_Table) {
  case (Table)0x1:
    if (str == (String *)0x0) goto switchD_0019f50b_default;
    bVar1 = Attacker::Verify((Attacker *)str,verifier);
    break;
  case (Table)0x2:
  case (Table)0x3:
  case (Table)0x4:
    uVar5 = (long)str - (long)verifier->buf_;
    if (((uVar5 & 3) != 0) && (((verifier->opts_).check_alignment & 1U) != 0)) {
      return false;
    }
    bVar1 = uVar5 <= verifier->size_ - 4 && 4 < verifier->size_;
    break;
  case (Table)0x5:
  case (Table)0x6:
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    break;
  default:
    goto switchD_0019f50b_default;
  }
  if (bVar1 == false) {
    return false;
  }
switchD_0019f50b_default:
  bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8);
  if (bVar1) {
    if (*(ushort *)(this + -(long)*(int *)this) < 9) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(this + (8 - (long)*(int *)this));
    }
    if (uVar3 == 0) {
      pMVar6 = (Movie *)0x0;
    }
    else {
      pMVar6 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
    }
    if ((pMVar6 != (Movie *)0x0) &&
       (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                          (verifier,(uint8_t *)pMVar6,1,(size_t *)0x0), !bVar1)) {
      return false;
    }
    bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10);
    if (bVar1) {
      if (*(ushort *)(this + -(long)*(int *)this) < 0xb) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(this + (10 - (long)*(int *)this));
      }
      if (uVar3 == 0) {
        pMVar6 = (Movie *)0x0;
      }
      else {
        pMVar6 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
      }
      if ((pMVar6 != (Movie *)0x0) &&
         (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)pMVar6,4,(size_t *)0x0), !bVar1)) {
        return false;
      }
      lVar4 = -(long)*(int *)this;
      if (*(ushort *)(this + -(long)*(int *)this) < 0xb) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(this + lVar4 + 10);
      }
      if (uVar3 == 0) {
        values = (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0;
      }
      else {
        values = (Vector<flatbuffers::Offset<void>,_unsigned_int> *)
                 (this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
      }
      if (*(ushort *)(this + -(long)*(int *)this) < 9) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(this + lVar4 + 8);
      }
      if (uVar3 == 0) {
        types = (Vector<unsigned_char,_unsigned_int> *)0x0;
      }
      else {
        types = (Vector<unsigned_char,_unsigned_int> *)
                (this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
      }
      bVar1 = VerifyCharacterVector(verifier,values,types);
      if (bVar1) {
        verifier->depth_ = verifier->depth_ - 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<uint8_t>(verifier, VT_MAIN_CHARACTER_TYPE, 1) &&
           VerifyOffset(verifier, VT_MAIN_CHARACTER) &&
           VerifyCharacter(verifier, main_character(), main_character_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS_TYPE) &&
           verifier.VerifyVector(characters_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS) &&
           verifier.VerifyVector(characters()) &&
           VerifyCharacterVector(verifier, characters(), characters_type()) &&
           verifier.EndTable();
  }